

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O1

IterateResult __thiscall deqp::UniformBlockCase::iterate(UniformBlockCase *this)

{
  ShaderInterface *this_00;
  pointer *pppSVar1;
  _Alloc_hider __s;
  iterator __position;
  RenderContext *renderCtx;
  Context *pCVar2;
  mapped_type pvVar3;
  ContextInfo *pCVar4;
  code *pcVar5;
  void *pvVar6;
  pointer piVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer puVar10;
  pointer pcVar11;
  int iVar12;
  DataType DVar13;
  deUint32 dVar14;
  deBool dVar15;
  deUint32 dVar16;
  DataType DVar17;
  undefined4 extraout_var;
  undefined8 *puVar18;
  pointer pUVar19;
  long *plVar20;
  mapped_type *ppvVar21;
  pointer pBVar22;
  pointer pBVar23;
  char *pcVar24;
  size_t sVar25;
  pointer ppUVar26;
  mapped_type_conflict *pmVar27;
  TestError *this_01;
  uint uVar28;
  int iVar29;
  _func_int **pp_Var30;
  long *plVar31;
  int iVar32;
  undefined8 *puVar33;
  deUint32 binding;
  UniformBlock *pUVar34;
  deUint32 binding_1;
  ulong uVar35;
  undefined1 isVertex;
  uint uVar36;
  ulong in_R9;
  long lVar37;
  undefined1 auVar38 [8];
  pointer pUVar39;
  pointer pBVar40;
  long lVar41;
  bool bVar42;
  bool bVar43;
  int numActiveUniforms;
  int curOffset;
  UniformBufferManager bufferManager;
  int numActiveBlocks;
  UniformLayout glLayout;
  int nameLen;
  int numBlockUniforms;
  deUint32 type;
  int size_1;
  GLsizei nameLen_1;
  UniformLayout refLayout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<char,_std::allocator<char>_> nameBuf_1;
  vector<int,_std::allocator<int>_> blockIndices;
  Random rnd;
  vector<int,_std::allocator<int>_> rowMajorFlags;
  vector<int,_std::allocator<int>_> matrixStrides;
  vector<int,_std::allocator<int>_> arrayStrides;
  vector<int,_std::allocator<int>_> offsets;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> blockPointers;
  ShaderProgram program;
  ostringstream vtxSrc;
  ostringstream fragSrc;
  char *local_808;
  int local_7fc;
  UniformBlockCase *local_7f8;
  long local_7f0;
  UniformBlock *local_7e8;
  undefined1 local_7e0 [32];
  _Base_ptr local_7c0;
  size_t local_7b8;
  value_type local_7b0;
  int local_78c;
  undefined1 local_788 [24];
  vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_> vStack_770;
  TestLog *local_758;
  int local_74c;
  int local_748;
  allocator<char> local_741;
  vector<int,_std::allocator<int>_> local_740;
  vector<int,_std::allocator<int>_> local_720;
  pointer local_708;
  pointer local_700;
  int local_6f4;
  int local_6f0;
  int local_6ec;
  UniformLayout local_6e8;
  ulong local_6b0;
  ulong local_6a8;
  long local_6a0;
  long local_698;
  pointer local_690;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_688;
  vector<char,_std::allocator<char>_> local_668;
  vector<int,_std::allocator<int>_> local_650;
  undefined1 local_638 [8];
  undefined1 auStack_630 [8];
  undefined1 local_628 [16];
  _Alloc_hider local_618;
  pointer local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_608 [4];
  ios_base local_5c8 [8];
  ios_base local_5c0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_5a8;
  undefined1 local_588 [208];
  vector<int,_std::allocator<int>_> local_4b8;
  vector<int,_std::allocator<int>_> local_4a0;
  vector<int,_std::allocator<int>_> local_488;
  vector<int,_std::allocator<int>_> local_470;
  ulong local_458;
  long local_450;
  ulong local_448;
  long *local_440 [2];
  long local_430 [2];
  undefined1 local_420 [16];
  pointer local_410;
  pointer local_408;
  pointer local_400;
  pointer local_3f8;
  ShaderProgram local_3f0;
  undefined1 local_320 [16];
  _func_int *local_310 [12];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [16];
  _func_int *local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_758 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_7f0 = CONCAT44(extraout_var,iVar12);
  local_6e8.uniforms.
  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e8.uniforms.
  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8.blocks.
  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8.uniforms.
  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e8.blocks.
  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e8.blocks.
  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408 = (pointer)(local_420 + 8);
  local_420._8_4_ = _S_red;
  local_410 = (pointer)0x0;
  local_3f8 = (pointer)0x0;
  local_7f8 = this;
  local_400 = local_408;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_708 = (pointer)((ulong)((long)(local_7f8->m_interface).m_uniformBlocks.
                                      super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_7f8->m_interface).m_uniformBlocks.
                                     super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)(uint)local_708) {
    local_708 = (pointer)(ulong)((uint)local_708 & 0x7fffffff);
    lVar41 = 0;
    do {
      local_7e8 = (local_7f8->m_interface).m_uniformBlocks.
                  super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar41];
      bVar42 = (local_7e8->m_instanceName)._M_string_length == 0;
      bVar43 = (local_7e8->m_instanceName)._M_dataplus._M_p == (pointer)0x0;
      local_6a0 = lVar41;
      if (bVar43 || bVar42) {
        pp_Var30 = local_310;
        puVar33 = (undefined8 *)(local_320 + 8);
        local_320._0_8_ = pp_Var30;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_440,(local_7e8->m_blockName)._M_dataplus._M_p,&local_741);
        puVar18 = (undefined8 *)std::__cxx11::string::append((char *)local_440);
        local_320._0_8_ = local_310;
        pp_Var30 = (_func_int **)(puVar18 + 2);
        if ((_func_int **)*puVar18 == pp_Var30) {
          local_310[0] = *pp_Var30;
          local_310[1] = (_func_int *)puVar18[3];
        }
        else {
          local_310[0] = *pp_Var30;
          local_320._0_8_ = (_func_int **)*puVar18;
        }
        puVar33 = puVar18 + 1;
        local_320._8_8_ = puVar18[1];
        *puVar18 = pp_Var30;
      }
      pUVar34 = local_7e8;
      *puVar33 = 0;
      *(undefined1 *)pp_Var30 = 0;
      if ((!bVar43 && !bVar42) && (local_440[0] != local_430)) {
        operator_delete(local_440[0],local_430[0] + 1);
      }
      local_700 = (pointer)((long)local_6e8.uniforms.
                                  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_6e8.uniforms.
                                 super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      local_7e0._0_8_ = local_7e0._0_8_ & 0xffffffff00000000;
      pUVar39 = (pUVar34->m_uniforms).
                super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pUVar39 !=
          (pUVar34->m_uniforms).
          super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar35 = (long)local_6e8.blocks.
                       super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_6e8.blocks.
                       super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_638 = (undefined1  [8])(auStack_630 + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_638,local_320._0_8_,
                     (undefined1 *)(local_320._8_8_ + local_320._0_8_));
          std::__cxx11::string::append((char *)local_638);
          uVar36 = pUVar39->m_flags;
          uVar28 = uVar36;
          if ((uVar36 & 0x38) == 0) {
            uVar28 = local_7e8->m_flags;
          }
          if ((uVar36 & 0xc0) == 0) {
            uVar36 = local_7e8->m_flags;
          }
          uVar36 = uVar36 & 0xc0 | uVar28 & 0x38;
          in_R9 = (ulong)uVar36;
          ub::anon_unknown_1::computeStd140Layout
                    (&local_6e8,(int *)local_7e0,(int)(uVar35 >> 6),(string *)local_638,
                     &pUVar39->m_type,uVar36);
          if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
            operator_delete((void *)local_638,local_628._0_8_ + 1);
          }
          pUVar39 = pUVar39 + 1;
          pUVar34 = local_7e8;
        } while (pUVar39 !=
                 (local_7e8->m_uniforms).
                 super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      uVar35 = (long)local_6e8.uniforms.
                     super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_6e8.uniforms.
                     super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_700 = (pointer)((ulong)local_700 >> 6);
      local_698 = CONCAT44(local_698._4_4_,local_7e0._0_4_);
      local_74c = pUVar34->m_arraySize;
      if (pUVar34->m_arraySize < 2) {
        local_74c = 1;
      }
      iVar12 = 0;
      do {
        local_638 = (undefined1  [8])(auStack_630 + 8);
        auStack_630 = (undefined1  [8])0x0;
        local_628._0_8_ = local_628._0_8_ & 0xffffffffffffff00;
        local_618._M_p = local_618._M_p & 0xffffffff00000000;
        aaStack_608[0]._8_8_ = (pointer)0x0;
        local_610 = (pointer)0x0;
        aaStack_608[0]._M_allocated_capacity = (pointer)0x0;
        std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
        emplace_back<deqp::ub::BlockLayoutEntry>(&local_6e8.blocks,(BlockLayoutEntry *)local_638);
        if (local_610 != (pointer)0x0) {
          operator_delete(local_610,aaStack_608[0]._8_8_ - (long)local_610);
        }
        local_748 = iVar12;
        if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
          operator_delete((void *)local_638,local_628._0_8_ + 1);
        }
        pBVar22 = local_6e8.blocks.
                  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar23 = local_6e8.blocks.
                  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        __s._M_p = (pUVar34->m_blockName)._M_dataplus._M_p;
        pcVar24 = (char *)local_6e8.blocks.
                          super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].name._M_string_length;
        strlen(__s._M_p);
        local_690 = pBVar23;
        std::__cxx11::string::_M_replace((ulong)pBVar23,0,pcVar24,(ulong)__s._M_p);
        iVar12 = local_748;
        pBVar22[-1].size = (int)local_698;
        local_638._0_4_ = (int)local_700;
        iVar29 = (int)(uVar35 >> 6);
        if ((int)local_700 < iVar29) {
          pUVar19 = local_700;
          do {
            __position._M_current =
                 pBVar22[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pBVar22[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&pBVar22[-1].activeUniformIndices,
                         __position,(int *)local_638);
            }
            else {
              *__position._M_current = (int)pUVar19;
              pBVar22[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar36 = local_638._0_4_ + 1;
            pUVar19 = (pointer)(ulong)uVar36;
            local_638._0_4_ = uVar36;
          } while ((int)uVar36 < iVar29);
        }
        pppSVar1 = &local_3f0.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        if (0 < local_7e8->m_arraySize) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
          std::ostream::operator<<((BlockLayoutEntry *)local_638,iVar12);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
          std::ios_base::~ios_base(local_5c8);
          plVar20 = (long *)std::__cxx11::string::replace((ulong)local_788,0,(char *)0x0,0x1cd140e);
          plVar31 = plVar20 + 2;
          if ((pointer *)*plVar20 == (pointer *)plVar31) {
            local_3f0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar31;
            local_3f0.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar20[3];
            local_3f0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pppSVar1;
          }
          else {
            local_3f0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar31;
            local_3f0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar20;
          }
          local_3f0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar20[1];
          *plVar20 = (long)plVar31;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          plVar20 = (long *)std::__cxx11::string::append((char *)&local_3f0);
          pp_Var30 = (_func_int **)(plVar20 + 2);
          if ((_func_int **)*plVar20 == pp_Var30) {
            local_198 = *pp_Var30;
            lStack_190 = plVar20[3];
            local_1a8._0_8_ = &local_198;
          }
          else {
            local_198 = *pp_Var30;
            local_1a8._0_8_ = (_func_int **)*plVar20;
          }
          local_1a8._8_8_ = plVar20[1];
          *plVar20 = (long)pp_Var30;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_690,local_1a8._0_8_);
          if ((_func_int **)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198 + 1));
          }
          if (local_3f0.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)pppSVar1) {
            operator_delete(local_3f0.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_3f0.m_shaders[0].
                                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          if ((undefined1 *)local_788._0_8_ != local_788 + 0x10) {
            operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
          }
        }
        iVar12 = iVar12 + 1;
        pUVar34 = local_7e8;
      } while (iVar12 != local_74c);
      if ((_func_int **)local_320._0_8_ != local_310) {
        operator_delete((void *)local_320._0_8_,(ulong)(local_310[0] + 1));
      }
      lVar41 = local_6a0 + 1;
    } while ((pointer)lVar41 != local_708);
  }
  uVar35 = 0;
  pBVar23 = local_6e8.blocks.
            super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_6e8.blocks.
      super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_6e8.blocks.
      super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar36 = (int)uVar35 + pBVar23->size;
      uVar35 = (ulong)uVar36;
      pBVar23 = pBVar23 + 1;
    } while (pBVar23 !=
             local_6e8.blocks.
             super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    uVar35 = (ulong)(int)uVar36;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_688,uVar35);
  local_638 = (undefined1  [8])((ulong)local_638 & 0xffffffff00000000);
  if (0 < (int)((ulong)((long)local_6e8.blocks.
                              super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_6e8.blocks.
                             super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    iVar12 = 0;
    do {
      puVar10 = local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppvVar21 = std::
                 map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                 operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                             *)local_420,(key_type_conflict *)local_638);
      *ppvVar21 = puVar10 + iVar12;
      iVar29 = local_638._0_4_ + 1;
      iVar12 = iVar12 + local_6e8.blocks.
                        super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)local_638._0_4_].size;
      local_638._0_4_ = iVar29;
    } while (iVar29 < (int)((ulong)((long)local_6e8.blocks.
                                          super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_6e8.blocks.
                                         super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  deRandom_init((deRandom *)local_638,1);
  local_6b0 = (ulong)((long)local_6e8.blocks.
                            super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_6e8.blocks.
                           super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6;
  if (0 < (int)(uint)local_6b0) {
    local_6b0 = (ulong)((uint)local_6b0 & 0x7fffffff);
    uVar35 = 0;
    do {
      pBVar40 = (pointer)(local_420 + 8);
      pBVar22 = pBVar40;
      for (pBVar23 = local_410; pBVar23 != (pointer)0x0;
          pBVar23 = *(pointer *)
                     ((long)&(pBVar23->name).field_2 +
                     (ulong)((long)pBVar23->size < (long)uVar35) * 8)) {
        if ((long)uVar35 <= (long)pBVar23->size) {
          pBVar22 = pBVar23;
        }
      }
      pBVar23 = pBVar40;
      if ((pBVar22 != pBVar40) && (pBVar23 = pBVar22, (long)uVar35 < (long)pBVar22->size)) {
        pBVar23 = pBVar40;
      }
      local_458 = uVar35;
      local_450 = uVar35 * 0x40;
      local_6a8 = (ulong)((long)local_6e8.blocks.
                                super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar35].
                                activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_6e8.blocks.
                               super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar35].
                               activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2;
      uVar36 = (uint)local_6a8;
      if (0 < (int)uVar36) {
        local_708 = (pBVar23->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        local_6a8 = (ulong)(uVar36 & 0x7fffffff);
        uVar35 = 0;
        do {
          pUVar19 = local_6e8.uniforms.
                    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar12 = *(int *)(*(long *)((long)&((local_6e8.blocks.
                                               super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             activeUniformIndices).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + local_450) +
                           uVar35 * 4);
          DVar13 = glu::getDataTypeScalarType
                             (local_6e8.uniforms.
                              super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar12].type);
          pUVar19 = pUVar19 + iVar12;
          iVar12 = glu::getDataTypeScalarSize(pUVar19->type);
          DVar17 = pUVar19->type;
          bVar42 = DVar17 - TYPE_FLOAT_MAT2 < 9;
          bVar43 = DVar17 - TYPE_DOUBLE_MAT2 < 9;
          local_7e8 = (UniformBlock *)CONCAT44(local_7e8._4_4_,1);
          local_748 = CONCAT31(local_748._1_3_,bVar43 || bVar42);
          if (bVar43 || bVar42) {
            if (pUVar19->isRowMajor == true) {
              iVar29 = glu::getDataTypeMatrixNumRows(DVar17);
              local_7e8 = (UniformBlock *)CONCAT44(local_7e8._4_4_,iVar29);
            }
            else {
              iVar29 = glu::getDataTypeMatrixNumColumns(DVar17);
              local_7e8 = (UniformBlock *)CONCAT44(local_7e8._4_4_,iVar29);
            }
          }
          local_448 = uVar35;
          local_6a0 = CONCAT44(local_6a0._4_4_,pUVar19->size);
          if (0 < pUVar19->size) {
            pBVar23 = (pointer)((long)iVar12 / (long)(int)local_7e8 & 0xffffffff);
            local_690 = pBVar23;
            iVar12 = 0;
            local_700 = pUVar19;
            do {
              local_74c = iVar12;
              iVar12 = pUVar19->arrayStride * iVar12;
              if ((int)local_6a0 < 2) {
                iVar12 = 0;
              }
              if (0 < (int)local_7e8) {
                local_698 = (long)local_708 + (long)iVar12 + (long)pUVar19->offset;
                iVar12 = 0;
                do {
                  lVar41 = (long)(pUVar19->matrixStride * iVar12);
                  if ((char)local_748 == '\0') {
                    lVar41 = 0;
                  }
                  if (0 < (int)local_690) {
                    lVar41 = lVar41 + local_698;
                    lVar37 = 0;
                    do {
                      if ((int)DVar13 < 0x1f) {
                        if (DVar13 == TYPE_FLOAT) {
                          dVar14 = deRandom_getUint32((deRandom *)local_638);
                          *(float *)(lVar41 + (int)lVar37) = (float)(int)(dVar14 % 0x13 - 9);
                        }
                        else if (DVar13 == TYPE_INT) {
                          dVar14 = deRandom_getUint32((deRandom *)local_638);
                          uVar36 = dVar14 % 0x13 - 9;
                          goto LAB_00df1bbc;
                        }
                      }
                      else {
                        if (DVar13 == TYPE_UINT) {
                          dVar14 = deRandom_getUint32((deRandom *)local_638);
                          uVar36 = dVar14 % 10;
                        }
                        else {
                          if (DVar13 != TYPE_BOOL) goto LAB_00df1bc1;
                          dVar15 = deRandom_getBool((deRandom *)local_638);
                          uVar36 = 0;
                          if (dVar15 == 1) {
                            dVar14 = deRandom_getUint32((deRandom *)local_638);
                            uVar36 = dVar14 | 1;
                          }
                        }
LAB_00df1bbc:
                        *(uint *)(lVar41 + (int)lVar37) = uVar36;
                      }
LAB_00df1bc1:
                      lVar37 = lVar37 + 4;
                    } while ((long)pBVar23 * 4 - lVar37 != 0);
                  }
                  iVar12 = iVar12 + 1;
                  pUVar19 = local_700;
                } while (iVar12 != (int)local_7e8);
              }
              iVar12 = local_74c + 1;
            } while (iVar12 < pUVar19->size);
          }
          uVar35 = local_448 + 1;
        } while (uVar35 != local_6a8);
      }
      uVar35 = local_458 + 1;
    } while (uVar35 != local_6b0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar24 = glu::getGLSLVersionDeclaration(local_7f8->m_glslVersion);
  if (pcVar24 == (char *)0x0) {
    std::ios::clear((int)&local_808 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x4e8);
  }
  else {
    sVar25 = strlen(pcVar24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar24,sVar25);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"out mediump float v_vtxResult;\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  this_00 = &local_7f8->m_interface;
  local_638 = (undefined1  [8])0x0;
  auStack_630 = (undefined1  [8])0x0;
  local_628._0_8_ = 0;
  ub::ShaderInterface::getNamedStructs
            (this_00,(vector<const_deqp::ub::StructType_*,_std::allocator<const_deqp::ub::StructType_*>_>
                      *)local_638);
  if (local_638 != auStack_630) {
    auVar38 = local_638;
    do {
      ub::anon_unknown_1::generateFullDeclaration
                ((ostringstream *)local_320,*(StructType **)auVar38,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
      auVar38 = (undefined1  [8])((long)auVar38 + 8);
    } while (auVar38 != auStack_630);
  }
  ppUVar26 = (local_7f8->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_7f8->m_interface).m_uniformBlocks.
                              super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar26) >> 3)) {
    lVar41 = 0;
    do {
      if ((ppUVar26[lVar41]->m_flags & 0x100) != 0) {
        ub::anon_unknown_1::generateDeclaration((ostringstream *)local_320,ppUVar26[lVar41]);
      }
      lVar41 = lVar41 + 1;
      ppUVar26 = (local_7f8->m_interface).m_uniformBlocks.
                 super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar41 < (int)((ulong)((long)(local_7f8->m_interface).m_uniformBlocks.
                                          super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppUVar26) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "mediump float compare_float    (highp float a, highp float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }\nmediump float compare_vec2     (highp vec2 a, highp vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }\nmediump float compare_vec3     (highp vec3 a, highp vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }\nmediump float compare_vec4     (highp vec4 a, highp vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }\nmediump float compare_mat2     (highp mat2 a, highp mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }\nmediump float compare_mat2x3   (highp mat2x3 a, highp mat2x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1]); }\nmediump float compare_mat2x4   (highp mat2x4 a, highp mat2x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1]); }\nmediump float compare_mat3x2   (highp mat3x2 a, highp mat3x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2]); }\nmediump float compare_mat3     (highp mat3 a, highp mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }\nmediump float compare_mat3x4   (highp mat3x4 a, highp mat3x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2]); }\nmediump float compare_mat4x2   (highp mat4x2 a, highp mat4x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2])*compare_vec2(a[3], b[3]); }\nmediump float compare_mat4x3   (highp mat4x3 a, highp mat4x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2])*compare_vec3(a[3], b[3]); }\nmediump float compare_mat4     (highp mat4 a, highp mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }\nmediump float compare_int      (highp int a, highp int b)      { return a == b ? 1.0 : 0.0; }\nmediump float compare_ivec2    (highp ivec2 a, highp ivec2..." /* TRUNCATED STRING LITERAL */
             ,0xbd0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "\nvoid main (void)\n{\n    gl_Position = a_position;\n    mediump float result = 1.0;\n"
             ,0x52);
  ub::anon_unknown_1::generateCompareSrc
            ((ostringstream *)local_320,(char *)this_00,(ShaderInterface *)&local_6e8,
             (UniformLayout *)local_420,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             &DAT_00000001,SUB81(in_R9,0));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"    v_vtxResult = result;\n}\n",0x1c);
  if (local_638 != (undefined1  [8])0x0) {
    operator_delete((void *)local_638,local_628._0_8_ - (long)local_638);
  }
  pcVar24 = glu::getGLSLVersionDeclaration(local_7f8->m_glslVersion);
  if (pcVar24 == (char *)0x0) {
    std::ios::clear((int)&local_808 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x660);
  }
  else {
    sVar25 = strlen(pcVar24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar24,sVar25);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"in mediump float v_vtxResult;\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  local_638 = (undefined1  [8])0x0;
  auStack_630 = (undefined1  [8])0x0;
  local_628._0_8_ = 0;
  ub::ShaderInterface::getNamedStructs
            (this_00,(vector<const_deqp::ub::StructType_*,_std::allocator<const_deqp::ub::StructType_*>_>
                      *)local_638);
  if (local_638 != auStack_630) {
    auVar38 = local_638;
    do {
      ub::anon_unknown_1::generateFullDeclaration
                ((ostringstream *)local_1a8,(StructType *)((TestLog *)auVar38)->m_log,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
      auVar38 = (undefined1  [8])((long)auVar38 + 8);
    } while (auVar38 != auStack_630);
  }
  isVertex = (undefined1)in_R9;
  ppUVar26 = (local_7f8->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_7f8->m_interface).m_uniformBlocks.
                              super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar26) >> 3)) {
    lVar41 = 0;
    do {
      if ((ppUVar26[lVar41]->m_flags & 0x200) != 0) {
        ub::anon_unknown_1::generateDeclaration((ostringstream *)local_1a8,ppUVar26[lVar41]);
      }
      isVertex = (undefined1)in_R9;
      lVar41 = lVar41 + 1;
      ppUVar26 = (local_7f8->m_interface).m_uniformBlocks.
                 super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar41 < (int)((ulong)((long)(local_7f8->m_interface).m_uniformBlocks.
                                          super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppUVar26) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "mediump float compare_float    (highp float a, highp float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }\nmediump float compare_vec2     (highp vec2 a, highp vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }\nmediump float compare_vec3     (highp vec3 a, highp vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }\nmediump float compare_vec4     (highp vec4 a, highp vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }\nmediump float compare_mat2     (highp mat2 a, highp mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }\nmediump float compare_mat2x3   (highp mat2x3 a, highp mat2x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1]); }\nmediump float compare_mat2x4   (highp mat2x4 a, highp mat2x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1]); }\nmediump float compare_mat3x2   (highp mat3x2 a, highp mat3x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2]); }\nmediump float compare_mat3     (highp mat3 a, highp mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }\nmediump float compare_mat3x4   (highp mat3x4 a, highp mat3x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2]); }\nmediump float compare_mat4x2   (highp mat4x2 a, highp mat4x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2])*compare_vec2(a[3], b[3]); }\nmediump float compare_mat4x3   (highp mat4x3 a, highp mat4x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2])*compare_vec3(a[3], b[3]); }\nmediump float compare_mat4     (highp mat4 a, highp mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }\nmediump float compare_int      (highp int a, highp int b)      { return a == b ? 1.0 : 0.0; }\nmediump float compare_ivec2    (highp ivec2 a, highp ivec2..." /* TRUNCATED STRING LITERAL */
             ,0xbd0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nvoid main (void)\n{\n    mediump float result = 1.0;\n",0x34);
  ub::anon_unknown_1::generateCompareSrc
            ((ostringstream *)local_1a8,(char *)this_00,(ShaderInterface *)&local_6e8,
             (UniformLayout *)local_420,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)0x0
             ,(bool)isVertex);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    dEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n}\n",
             0x3c);
  if (local_638 != (undefined1  [8])0x0) {
    operator_delete((void *)local_638,local_628._0_8_ - (long)local_638);
  }
  renderCtx = ((local_7f8->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_788,(char *)local_7e0._0_8_,(allocator<char> *)&local_720);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,
             (char *)CONCAT44(local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (uint)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start),(allocator<char> *)&local_650)
  ;
  local_588[0x10] = 0;
  local_588._17_8_ = 0;
  local_588._0_8_ = (pointer)0x0;
  local_588[8] = 0;
  local_588._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_638,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_638,(value_type *)local_788);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_628 + 8),&local_7b0);
  glu::ShaderProgram::ShaderProgram(&local_3f0,renderCtx,(ProgramSources *)local_638);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_588);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_5a8);
  lVar41 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_638 + lVar41));
    lVar41 = lVar41 + -0x18;
  } while (lVar41 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  lVar41 = local_7f0;
  if ((pointer *)
      CONCAT44(local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_,
               (uint)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) !=
      &local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete((undefined1 *)
                    CONCAT44(local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (uint)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start),
                    (long)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((undefined1 *)local_788._0_8_ != local_788 + 0x10) {
    operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
  }
  if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
    operator_delete((void *)local_7e0._0_8_,(ulong)(local_7e0._16_8_ + 1));
  }
  glu::operator<<(local_758,&local_3f0);
  dVar14 = local_3f0.m_program.m_program;
  if (local_3f0.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((local_7f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Compile failed");
  }
  else {
    vStack_770.
    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_770.
    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_788._16_8_ = 0;
    vStack_770.
    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_788._0_8_ = (pointer)0x0;
    local_788._8_8_ = (pointer)0x0;
    local_7fc = 0;
    local_78c = 0;
    (**(code **)(lVar41 + 0x9d8))(local_3f0.m_program.m_program,0x8b86);
    (**(code **)(lVar41 + 0x9d8))(dVar14,0x8a36,&local_78c);
    dVar16 = (**(code **)(lVar41 + 0x800))();
    glu::checkError(dVar16,"Failed to get number of uniforms and uniform blocks",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                    ,0x45b);
    std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::resize
              ((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_> *)
               local_788,(long)local_78c);
    if (0 < local_78c) {
      lVar41 = 0x28;
      uVar35 = 0;
      do {
        uVar9 = local_788._0_8_;
        lVar37 = local_7f0;
        (**(code **)(local_7f0 + 0x760))(dVar14,uVar35 & 0xffffffff,0x8a40,&local_7b0);
        (**(code **)(lVar37 + 0x760))(dVar14,uVar35 & 0xffffffff,0x8a41,&local_740);
        (**(code **)(lVar37 + 0x760))(dVar14,uVar35 & 0xffffffff,0x8a42,&local_720);
        dVar16 = (**(code **)(lVar37 + 0x800))();
        glu::checkError(dVar16,"Uniform block query failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                        ,0x46a);
        uVar36 = (uint)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if ((int)(uint)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start < 2) {
          uVar36 = 1;
        }
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_7e0,(ulong)uVar36,
                   (allocator_type *)local_638);
        (**(code **)(local_7f0 + 0x758))
                  (dVar14,uVar35 & 0xffffffff,local_7e0._8_4_ - (int)local_7e0._0_8_,0);
        uVar8 = local_7e0._0_8_;
        local_638 = (undefined1  [8])(auStack_630 + 8);
        if ((pointer)local_7e0._0_8_ == (pointer)0x0) {
          pcVar24 = &DAT_00000001;
        }
        else {
          sVar25 = strlen((char *)local_7e0._0_8_);
          pcVar24 = (char *)(uVar8 + sVar25);
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_638,uVar8,pcVar24);
        std::__cxx11::string::operator=((string *)(uVar9 + lVar41 + -0x28),(string *)local_638);
        if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
          operator_delete((void *)local_638,local_628._0_8_ + 1);
        }
        *(undefined4 *)(uVar9 + lVar41 + -8) = local_7b0._M_dataplus._M_p._0_4_;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)(uVar9 + lVar41),
                   (long)(int)local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        if (0 < (int)local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) {
          (**(code **)(local_7f0 + 0x760))
                    (dVar14,uVar35 & 0xffffffff,0x8a43,
                     (((vector<int,_std::allocator<int>_> *)(uVar9 + lVar41))->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start);
        }
        dVar16 = (**(code **)(local_7f0 + 0x800))();
        glu::checkError(dVar16,"Uniform block query failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                        ,0x478);
        if ((pointer)local_7e0._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ - local_7e0._0_8_);
        }
        uVar35 = uVar35 + 1;
        lVar41 = lVar41 + 0x40;
      } while ((long)uVar35 < (long)local_78c);
    }
    lVar41 = local_7f0;
    if (0 < (long)local_7fc) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7e0,(long)local_7fc,
                 (allocator_type *)local_638);
      if (0 < local_7fc) {
        lVar37 = 0;
        do {
          *(int *)(local_7e0._0_8_ + lVar37 * 4) = (int)lVar37;
          lVar37 = lVar37 + 1;
        } while (lVar37 < local_7fc);
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_7b0,(long)local_7fc,
                 (allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_740,(long)local_7fc,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_720,(long)local_7fc,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_650,(long)local_7fc,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_470,(long)local_7fc,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_488,(long)local_7fc,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_4a0,(long)local_7fc,(allocator_type *)local_638);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_4b8,(long)local_7fc,(allocator_type *)local_638);
      (**(code **)(lVar41 + 0x770))
                (dVar14,(ulong)(CONCAT44(local_7e0._12_4_,local_7e0._8_4_) - local_7e0._0_8_) >> 2,
                 local_7e0._0_8_,0x8a37,local_7b0._M_dataplus._M_p);
      (**(code **)(lVar41 + 0x770))
                (dVar14,(ulong)(CONCAT44(local_7e0._12_4_,local_7e0._8_4_) - local_7e0._0_8_) >> 2,
                 local_7e0._0_8_,0x8a38,
                 CONCAT44(local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (uint)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start));
      (**(code **)(lVar41 + 0x770))
                (dVar14,(ulong)(CONCAT44(local_7e0._12_4_,local_7e0._8_4_) - local_7e0._0_8_) >> 2,
                 local_7e0._0_8_,0x8a39,
                 CONCAT44(local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start));
      (**(code **)(lVar41 + 0x770))
                (dVar14,(ulong)(CONCAT44(local_7e0._12_4_,local_7e0._8_4_) - local_7e0._0_8_) >> 2,
                 local_7e0._0_8_,0x8a3a,
                 local_650.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar41 + 0x770))
                (dVar14,(ulong)(CONCAT44(local_7e0._12_4_,local_7e0._8_4_) - local_7e0._0_8_) >> 2,
                 local_7e0._0_8_,0x8a3b,
                 local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar41 + 0x770))
                (dVar14,(ulong)(CONCAT44(local_7e0._12_4_,local_7e0._8_4_) - local_7e0._0_8_) >> 2,
                 local_7e0._0_8_,0x8a3c,
                 local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar41 + 0x770))
                (dVar14,(ulong)(CONCAT44(local_7e0._12_4_,local_7e0._8_4_) - local_7e0._0_8_) >> 2,
                 local_7e0._0_8_,0x8a3d,
                 local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar41 + 0x770))
                (dVar14,(ulong)(CONCAT44(local_7e0._12_4_,local_7e0._8_4_) - local_7e0._0_8_) >> 2,
                 local_7e0._0_8_,0x8a3e,
                 local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar16 = (**(code **)(lVar41 + 0x800))();
      glu::checkError(dVar16,"Active uniform query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                      ,0x49d);
      std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
      resize(&vStack_770,(long)local_7fc);
      if (0 < local_7fc) {
        lVar41 = 0;
        uVar35 = 0;
        do {
          pUVar19 = vStack_770.
                    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<char,_std::allocator<char>_>::vector
                    (&local_668,
                     (long)*(int *)(CONCAT44(local_720.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (int)local_720.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) +
                                   uVar35 * 4),(allocator_type *)local_638);
          local_6ec = 0;
          local_6f0 = 0;
          local_6f4 = 0;
          local_808 = local_668.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          (**(code **)(local_7f0 + 0x750))
                    (dVar14,uVar35 & 0xffffffff,
                     (int)local_668.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)local_668.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,&local_6ec,&local_6f0,&local_6f4);
          dVar16 = (**(code **)(local_7f0 + 0x800))();
          glu::checkError(dVar16,"Uniform name query failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                          ,0x4ac);
          pcVar11 = local_668.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((local_6ec + 1 !=
                *(int *)(CONCAT44(local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)local_720.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) + uVar35 * 4)) ||
              (local_6f0 !=
               *(int *)(CONCAT44(local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 (uint)local_740.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) + uVar35 * 4))) ||
             (local_6f4 != *(int *)(local_7b0._M_dataplus._M_p + uVar35 * 4))) {
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,
                       "Values returned by glGetActiveUniform() don\'t match with values queried with glGetActiveUniformsiv()."
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                       ,0x4b2);
            __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          local_638 = (undefined1  [8])(auStack_630 + 8);
          if (local_668.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == (char *)0x0) {
            pcVar24 = &DAT_00000001;
          }
          else {
            sVar25 = strlen(local_668.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
            pcVar24 = pcVar11 + sVar25;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_638,pcVar11,pcVar24);
          std::__cxx11::string::operator=((string *)((long)pUVar19 + lVar41),(string *)local_638);
          if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
            operator_delete((void *)local_638,local_628._0_8_ + 1);
          }
          DVar17 = glu::getDataTypeFromGLType
                             (*(deUint32 *)(local_7b0._M_dataplus._M_p + uVar35 * 4));
          *(DataType *)((long)pUVar19 + 0x20 + lVar41) = DVar17;
          *(undefined4 *)((long)pUVar19 + 0x24 + lVar41) =
               *(undefined4 *)
                (CONCAT44(local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (uint)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) + uVar35 * 4);
          *(int *)((long)pUVar19 + 0x28 + lVar41) =
               local_650.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar35];
          *(int *)((long)pUVar19 + 0x2c + lVar41) =
               local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar35];
          *(int *)((long)pUVar19 + 0x30 + lVar41) =
               local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar35];
          *(int *)((long)pUVar19 + 0x34 + lVar41) =
               local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar35];
          *(bool *)((long)pUVar19 + 0x38 + lVar41) =
               local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar35] != 0;
          if (local_668.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (char *)0x0) {
            operator_delete(local_668.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_668.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_668.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          uVar35 = uVar35 + 1;
          lVar41 = lVar41 + 0x40;
        } while ((long)uVar35 < (long)local_7fc);
      }
      if (local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_650.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_650.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_650.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_650.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pvVar6 = (void *)CONCAT44(local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,(long)local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
      }
      pvVar6 = (void *)CONCAT44(local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (uint)local_740.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,(long)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_7b0._M_dataplus._M_p,
                        local_7b0.field_2._M_allocated_capacity - (long)local_7b0._M_dataplus._M_p);
      }
      if ((pointer)local_7e0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_7e0._0_8_,local_7e0._16_8_ - local_7e0._0_8_);
      }
    }
    local_7e0._0_8_ = local_7e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"ActiveUniformBlocks","");
    local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"Active Uniform Blocks","")
    ;
    tcu::LogSection::LogSection((LogSection *)local_638,(string *)local_7e0,&local_7b0);
    tcu::TestLog::startSection(local_758,(char *)local_638,local_618._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_p != aaStack_608) {
      operator_delete(local_618._M_p,(ulong)(aaStack_608[0]._M_allocated_capacity + 1));
    }
    if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
      operator_delete((void *)local_638,local_628._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
      operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
      operator_delete((void *)local_7e0._0_8_,(ulong)(local_7e0._16_8_ + 1));
    }
    if (0 < (int)((ulong)(local_788._8_8_ - local_788._0_8_) >> 6)) {
      lVar37 = 0;
      lVar41 = 0;
      do {
        local_638 = (undefined1  [8])local_758;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_630);
        std::ostream::operator<<((ostringstream *)auStack_630,(int)lVar41);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_630,": ",2);
        ub::operator<<((ostream *)auStack_630,(BlockLayoutEntry *)(local_788._0_8_ + lVar37));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_638,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_630);
        std::ios_base::~ios_base(local_5c0);
        lVar41 = lVar41 + 1;
        lVar37 = lVar37 + 0x40;
      } while (lVar41 < (int)((ulong)(local_788._8_8_ - local_788._0_8_) >> 6));
    }
    tcu::TestLog::endSection(local_758);
    local_7e0._0_8_ = local_7e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"ActiveUniforms","");
    local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"Active Uniforms","");
    tcu::LogSection::LogSection((LogSection *)local_638,(string *)local_7e0,&local_7b0);
    tcu::TestLog::startSection(local_758,(char *)local_638,local_618._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_p != aaStack_608) {
      operator_delete(local_618._M_p,(ulong)(aaStack_608[0]._M_allocated_capacity + 1));
    }
    if (local_638 != (undefined1  [8])(auStack_630 + 8)) {
      operator_delete((void *)local_638,local_628._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
      operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
      operator_delete((void *)local_7e0._0_8_,(ulong)(local_7e0._16_8_ + 1));
    }
    if (0 < (int)((ulong)((long)vStack_770.
                                super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vStack_770.
                               super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
      lVar37 = 0;
      lVar41 = 0;
      do {
        local_638 = (undefined1  [8])local_758;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_630);
        std::ostream::operator<<((ostringstream *)auStack_630,(int)lVar41);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_630,": ",2);
        ub::operator<<((ostream *)auStack_630,
                       (UniformLayoutEntry *)
                       ((long)vStack_770.
                              super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar37));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_638,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_630);
        std::ios_base::~ios_base(local_5c0);
        lVar41 = lVar41 + 1;
        lVar37 = lVar37 + 0x40;
      } while (lVar41 < (int)((ulong)((long)vStack_770.
                                            super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)vStack_770.
                                           super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 6));
    }
    tcu::TestLog::endSection(local_758);
    lVar41 = local_7f0;
    bVar42 = checkLayoutIndices(local_7f8,(UniformLayout *)local_788);
    if (((bVar42) && (bVar42 = checkLayoutBounds(local_7f8,(UniformLayout *)local_788), bVar42)) &&
       (bVar42 = compareTypes(local_7f8,&local_6e8,(UniformLayout *)local_788), bVar42)) {
      bVar42 = compareStd140Blocks(local_7f8,&local_6e8,(UniformLayout *)local_788);
      if (!bVar42) {
        tcu::TestContext::setTestResult
                  ((local_7f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid std140 layout");
      }
      bVar42 = compareSharedBlocks(local_7f8,&local_6e8,(UniformLayout *)local_788);
      if (!bVar42) {
        tcu::TestContext::setTestResult
                  ((local_7f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid shared layout");
      }
      bVar42 = checkIndexQueries(local_7f8,local_3f0.m_program.m_program,(UniformLayout *)local_788)
      ;
      if (!bVar42) {
        tcu::TestContext::setTestResult
                  ((local_7f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Inconsintent block index query results");
      }
      (**(code **)(lVar41 + 0x1680))(local_3f0.m_program.m_program);
      if (0 < (int)((ulong)(local_788._8_8_ - local_788._0_8_) >> 6)) {
        iVar12 = 0;
        do {
          (**(code **)(local_7f0 + 0x15d0))(local_3f0.m_program.m_program,iVar12,iVar12);
          iVar12 = iVar12 + 1;
        } while (iVar12 < (int)((ulong)(local_788._8_8_ - local_788._0_8_) >> 6));
      }
      dVar14 = (**(code **)(local_7f0 + 0x800))();
      glu::checkError(dVar14,"Failed to set uniform block bindings",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                      ,0x5a2);
      pCVar2 = (local_7f8->super_TestCase).m_context;
      local_7b0._M_dataplus._M_p = (pointer)pCVar2->m_renderCtx;
      local_7b0._M_string_length = 0;
      local_7b0.field_2._M_allocated_capacity = 0;
      local_7b0.field_2._8_8_ = 0;
      uVar36 = (uint)((ulong)(local_788._8_8_ - local_788._0_8_) >> 6);
      if (local_7f8->m_bufferMode == BUFFERMODE_PER_BLOCK) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_7e0,(long)(int)uVar36,(allocator_type *)local_638);
        local_628._8_8_ = auStack_630;
        auStack_630 = (undefined1  [8])((ulong)auStack_630 & 0xffffffff00000000);
        local_628._0_8_ = 0;
        local_610 = (pointer)0x0;
        local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        local_618._M_p = (pointer)local_628._8_8_;
        if (0 < (int)uVar36) {
          do {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (local_7e0._0_8_ +
                       (long)(int)(uint)local_740.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start * 0x18),
                       (long)*(int *)(local_788._0_8_ +
                                     (long)(int)(uint)local_740.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start *
                                     0x40 + 0x20));
            pvVar3 = *(mapped_type *)
                      (local_7e0._0_8_ +
                      (long)(int)(uint)local_740.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start * 0x18);
            ppvVar21 = std::
                       map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                       ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                     *)local_638,(key_type_conflict *)&local_740);
            *ppvVar21 = pvVar3;
            local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (uint)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
          } while ((int)(uint)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start < (int)uVar36);
        }
        ub::anon_unknown_1::copyUniformData
                  ((UniformLayout *)local_788,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_638,&local_6e8,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_420);
        if (0 < (int)uVar36) {
          lVar41 = 8;
          uVar35 = 0;
          do {
            dVar14 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)&local_7b0);
            (**(code **)(local_7f0 + 0x40))(0x8a11,dVar14);
            (**(code **)(local_7f0 + 0x150))
                      (0x8a11,*(long *)(local_7e0._0_8_ + lVar41) -
                              *(long *)(local_7e0._0_8_ + lVar41 + -8),
                       *(long *)(local_7e0._0_8_ + lVar41 + -8),0x88e4);
            dVar16 = (**(code **)(local_7f0 + 0x800))();
            glu::checkError(dVar16,"Failed to upload uniform buffer data",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                            ,0x5bc);
            (**(code **)(local_7f0 + 0x48))(0x8a11,uVar35 & 0xffffffff,dVar14);
            dVar14 = (**(code **)(local_7f0 + 0x800))();
            glu::checkError(dVar14,"glBindBufferBase(GL_UNIFORM_BUFFER) failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                            ,0x5bf);
            uVar35 = uVar35 + 1;
            lVar41 = lVar41 + 0x18;
          } while ((uVar36 & 0x7fffffff) != uVar35);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     *)local_638);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_7e0);
      }
      else {
        pCVar4 = pCVar2->m_contextInfo;
        iVar12 = (*pCVar4->_vptr_ContextInfo[2])(pCVar4,0x8a34);
        local_628._8_8_ = auStack_630;
        uVar35 = 0;
        auStack_630 = (undefined1  [8])((ulong)auStack_630 & 0xffffffff00000000);
        local_628._0_8_ = 0;
        local_610 = (pointer)0x0;
        local_7e0._0_8_ = local_7e0._0_8_ & 0xffffffff00000000;
        local_618._M_p = (pointer)local_628._8_8_;
        if (0 < (int)uVar36) {
          do {
            iVar29 = (int)uVar35;
            if ((0 < iVar12) && ((iVar29 / iVar12) * iVar12 != iVar29)) {
              iVar29 = (iVar29 / iVar12 + 1) * iVar12;
            }
            pmVar27 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_638,(key_type_conflict *)local_7e0);
            *pmVar27 = iVar29;
            lVar41 = (long)(int)local_7e0._0_4_;
            iVar32 = local_7e0._0_4_ + 1;
            uVar35 = (ulong)(uint)(iVar29 + *(int *)(local_788._0_8_ + lVar41 * 0x40 + 0x20));
            local_7e0._0_4_ = iVar32;
          } while (iVar32 < (int)uVar36);
          uVar35 = (ulong)(iVar29 + *(int *)(local_788._0_8_ + lVar41 * 0x40 + 0x20));
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_740,uVar35,
                   (allocator_type *)local_7e0);
        local_7e0._24_8_ = local_7e0 + 8;
        local_7e0._8_4_ = _S_red;
        local_7e0._16_8_ = (pointer)0x0;
        local_7b8 = 0;
        local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        local_7c0 = (_Base_ptr)local_7e0._24_8_;
        if (0 < (int)uVar36) {
          do {
            pmVar27 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_638,(key_type_conflict *)&local_720);
            iVar12 = *pmVar27;
            lVar41 = CONCAT44(local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (uint)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            ppvVar21 = std::
                       map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                       ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                     *)local_7e0,(key_type_conflict *)&local_720);
            *ppvVar21 = (mapped_type)(lVar41 + iVar12);
            local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (int)local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
          } while ((int)local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < (int)uVar36);
        }
        ub::anon_unknown_1::copyUniformData
                  ((UniformLayout *)local_788,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_7e0,&local_6e8,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_420);
        dVar14 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)&local_7b0);
        (**(code **)(local_7f0 + 0x40))(0x8a11,dVar14);
        piVar7 = (pointer)CONCAT44(local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_740.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
        if (piVar7 != local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          (**(code **)(local_7f0 + 0x150))
                    (0x8a11,(long)local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar7,piVar7,0x88e4);
        }
        dVar16 = (**(code **)(local_7f0 + 0x800))();
        glu::checkError(dVar16,"Failed to upload uniform buffer data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                        ,0x5e7);
        local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        if (0 < (int)uVar36) {
          do {
            iVar12 = (int)local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            pcVar5 = *(code **)(local_7f0 + 0x50);
            pmVar27 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_638,(key_type_conflict *)&local_720);
            (*pcVar5)(0x8a11,iVar12,dVar14,(long)*pmVar27,
                      (long)*(int *)(local_788._0_8_ +
                                    (long)(int)local_720.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start * 0x40 + 0x20));
            dVar16 = (**(code **)(local_7f0 + 0x800))();
            glu::checkError(dVar16,"glBindBufferRange(GL_UNIFORM_BUFFER) failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                            ,0x5f0);
            local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (int)local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
          } while ((int)local_720.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < (int)uVar36);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     *)local_7e0);
        pvVar6 = (void *)CONCAT44(local_740.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (uint)local_740.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,(long)local_740.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar6);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)local_638);
      }
      bVar42 = render(local_7f8,&local_3f0);
      if (!bVar42) {
        tcu::TestContext::setTestResult
                  ((local_7f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image compare failed");
      }
      ub::UniformBufferManager::~UniformBufferManager((UniformBufferManager *)&local_7b0);
    }
    else {
      tcu::TestContext::setTestResult
                ((local_7f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Invalid layout");
    }
    std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
    ~vector(&vStack_770);
    std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::~vector
              ((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_> *)
               local_788);
  }
  glu::ShaderProgram::~ShaderProgram(&local_3f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::
  _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *)local_420);
  if (local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_688.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_688.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::~vector
            (&local_6e8.uniforms);
  std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::~vector
            (&local_6e8.blocks);
  return STOP;
}

Assistant:

UniformBlockCase::IterateResult UniformBlockCase::iterate(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
	UniformLayout		  refLayout; //!< std140 layout.
	vector<deUint8>		  data;		 //!< Data.
	map<int, void*> blockPointers;   //!< Reference block pointers.

	// Initialize result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Compute reference layout.
	computeStd140Layout(refLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (vector<BlockLayoutEntry>::const_iterator blockIter = refLayout.blocks.begin();
			 blockIter != refLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)refLayout.blocks.size(); blockNdx++)
		{
			blockPointers[blockNdx] = &data[0] + curOffset;
			curOffset += refLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(refLayout, blockPointers, 1 /* seed */);

	// Generate shaders and build program.
	std::ostringstream vtxSrc;
	std::ostringstream fragSrc;

	generateVertexShader(vtxSrc, m_glslVersion, m_interface, refLayout, blockPointers);
	generateFragmentShader(fragSrc, m_glslVersion, m_interface, refLayout, blockPointers);

	glu::ShaderProgram program(m_context.getRenderContext(),
							   glu::makeVtxFragSources(vtxSrc.str().c_str(), fragSrc.str().c_str()));
	log << program;

	if (!program.isOk())
	{
		// Compile failed.
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Query layout from GL.
	UniformLayout glLayout;
	getGLUniformLayout(gl, glLayout, program.getProgram());

	// Print layout to log.
	log << TestLog::Section("ActiveUniformBlocks", "Active Uniform Blocks");
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
		log << TestLog::Message << blockNdx << ": " << glLayout.blocks[blockNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	log << TestLog::Section("ActiveUniforms", "Active Uniforms");
	for (int uniformNdx = 0; uniformNdx < (int)glLayout.uniforms.size(); uniformNdx++)
		log << TestLog::Message << uniformNdx << ": " << glLayout.uniforms[uniformNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	// Check that we can even try rendering with given layout.
	if (!checkLayoutIndices(glLayout) || !checkLayoutBounds(glLayout) || !compareTypes(refLayout, glLayout))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid layout");
		return STOP; // It is not safe to use the given layout.
	}

	// Verify all std140 blocks.
	if (!compareStd140Blocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid std140 layout");

	// Verify all shared blocks - all uniforms should be active, and certain properties match.
	if (!compareSharedBlocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid shared layout");

	// Check consistency with index queries
	if (!checkIndexQueries(program.getProgram(), glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsintent block index query results");

	// Use program.
	gl.useProgram(program.getProgram());

	// Assign binding points to all active uniform blocks.
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
	{
		deUint32 binding = (deUint32)blockNdx; // \todo [2012-01-25 pyry] Randomize order?
		gl.uniformBlockBinding(program.getProgram(), (deUint32)blockNdx, binding);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set uniform block bindings");

	// Allocate buffers, write data and bind to targets.
	UniformBufferManager bufferManager(m_context.getRenderContext());
	if (m_bufferMode == BUFFERMODE_PER_BLOCK)
	{
		int						 numBlocks = (int)glLayout.blocks.size();
		vector<vector<deUint8> > glData(numBlocks);
		map<int, void*> glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			glData[blockNdx].resize(glLayout.blocks[blockNdx].size);
			glBlockPointers[blockNdx] = &glData[blockNdx][0];
		}

		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 buffer  = bufferManager.allocBuffer();
			deUint32 binding = (deUint32)blockNdx;

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData[blockNdx].size(), &glData[blockNdx][0],
						  GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, binding, buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase(GL_UNIFORM_BUFFER) failed");
		}
	}
	else
	{
		DE_ASSERT(m_bufferMode == BUFFERMODE_SINGLE);

		int totalSize		 = 0;
		int curOffset		 = 0;
		int numBlocks		 = (int)glLayout.blocks.size();
		int bindingAlignment = m_context.getContextInfo().getInt(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT);
		map<int, int> glBlockOffsets;

		// Compute total size and offsets.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			if (bindingAlignment > 0)
				curOffset			 = deRoundUp32(curOffset, bindingAlignment);
			glBlockOffsets[blockNdx] = curOffset;
			curOffset += glLayout.blocks[blockNdx].size;
		}
		totalSize = curOffset;

		// Assign block pointers.
		vector<deUint8> glData(totalSize);
		map<int, void*> glBlockPointers;

		for (int blockNdx			  = 0; blockNdx < numBlocks; blockNdx++)
			glBlockPointers[blockNdx] = &glData[glBlockOffsets[blockNdx]];

		// Copy to gl format.
		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		// Allocate buffer and upload data.
		deUint32 buffer = bufferManager.allocBuffer();
		gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
		if (!glData.empty())
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData.size(), &glData[0], GL_STATIC_DRAW);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

		// Bind ranges to binding points.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 binding = (deUint32)blockNdx;
			gl.bindBufferRange(GL_UNIFORM_BUFFER, binding, buffer, (glw::GLintptr)glBlockOffsets[blockNdx],
							   (glw::GLsizeiptr)glLayout.blocks[blockNdx].size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_UNIFORM_BUFFER) failed");
			curOffset += glLayout.blocks[blockNdx].size;
		}
	}

	bool renderOk = render(program);
	if (!renderOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");

	return STOP;
}